

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNames
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *parent_location)

{
  Location *parent;
  bool bVar1;
  int path1;
  string *output;
  undefined1 local_40 [8];
  LocationRecorder location;
  LocationRecorder *parent_location_local;
  EnumDescriptorProto *message_local;
  Parser *this_local;
  
  location.location_ = (Location *)parent_location;
  do {
    parent = location.location_;
    path1 = EnumDescriptorProto::reserved_name_size(message);
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)local_40,(LocationRecorder *)parent,path1);
    output = EnumDescriptorProto::add_reserved_name_abi_cxx11_(message);
    bVar1 = ConsumeString(this,output,"Expected enum value.");
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
    if (!bVar1) goto LAB_006390de;
    bVar1 = TryConsume(this,",");
  } while (bVar1);
  bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)location.location_);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_006390de:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseReservedNames(EnumDescriptorProto* message,
                                const LocationRecorder& parent_location) {
  do {
    LocationRecorder location(parent_location, message->reserved_name_size());
    DO(ConsumeString(message->add_reserved_name(), "Expected enum value."));
  } while (TryConsume(","));
  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}